

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O3

void __thiscall asl::InetAddress::InetAddress(InetAddress *this,String *host,int port)

{
  Array<unsigned_char>::alloc(&this->_data,0);
  this->_type = IPv4;
  set(this,host,port);
  return;
}

Assistant:

ASL_EXPLICIT InetAddress(const String& host, int port) : _type(IPv4) { set(host, port); }